

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refl_coef_to_lpc.c
# Opt level: O1

void WebRtcSpl_ReflCoefToLpc(int16_t *k,int use_order,int16_t *a)

{
  short sVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  int16_t any [15];
  short local_58 [20];
  
  *a = 0x1000;
  local_58[0] = 0x1000;
  a[1] = (int16_t)((uint)(int)*k >> 3);
  if (1 < use_order) {
    uVar5 = 0;
    lVar2 = 1;
    do {
      sVar1 = k[1];
      k = k + 1;
      lVar3 = lVar2 + 1;
      local_58[lVar2 + 1] = (short)((uint)(int)sVar1 >> 3);
      lVar4 = 2;
      do {
        *(short *)((long)local_58 + lVar4) =
             (short)((uint)((int)a[lVar2] * (int)sVar1) >> 0xf) + *(short *)((long)a + lVar4);
        lVar4 = lVar4 + 2;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
      memcpy(a,local_58,uVar5 * 2 + 6);
      uVar5 = uVar5 + 1;
      lVar2 = lVar3;
    } while (uVar5 != use_order - 1);
  }
  return;
}

Assistant:

void WebRtcSpl_ReflCoefToLpc(const int16_t *k, int use_order, int16_t *a)
{
    int16_t any[WEBRTC_SPL_MAX_LPC_ORDER + 1];
    int16_t *aptr, *aptr2, *anyptr;
    const int16_t *kptr;
    int m, i;

    kptr = k;
    *a = 4096; // i.e., (Word16_MAX >> 3)+1.
    *any = *a;
    a[1] = *k >> 3;

    for (m = 1; m < use_order; m++)
    {
        kptr++;
        aptr = a;
        aptr++;
        aptr2 = &a[m];
        anyptr = any;
        anyptr++;

        any[m + 1] = *kptr >> 3;
        for (i = 0; i < m; i++)
        {
            *anyptr = *aptr + (int16_t)((*aptr2 * *kptr) >> 15);
            anyptr++;
            aptr++;
            aptr2--;
        }

        aptr = a;
        anyptr = any;
        for (i = 0; i < (m + 2); i++)
        {
            *aptr = *anyptr;
            aptr++;
            anyptr++;
        }
    }
}